

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void avgFinalize(sqlite3_context *context)

{
  double *pdVar1;
  double local_20;
  double r;
  SumCtx *p;
  sqlite3_context *context_local;
  
  pdVar1 = (double *)sqlite3_aggregate_context(context,0);
  if ((pdVar1 != (double *)0x0) && (0 < (long)pdVar1[3])) {
    if (*(char *)(pdVar1 + 4) == '\0') {
      local_20 = (double)(long)pdVar1[2];
    }
    else {
      local_20 = *pdVar1 + pdVar1[1];
    }
    sqlite3_result_double(context,local_20 / (double)(long)pdVar1[3]);
  }
  return;
}

Assistant:

static void avgFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    double r;
    if( p->approx ){
      r = p->rSum+p->rErr;
    }else{
      r = (double)(p->iSum);
    }
    sqlite3_result_double(context, r/(double)p->cnt);
  }
}